

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_linear_resampler_init
                    (ma_linear_resampler_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_linear_resampler *pResampler)

{
  ma_result mVar1;
  void *pHeap;
  size_t heapSizeInBytes;
  
  mVar1 = ma_linear_resampler_get_heap_size(pConfig,&heapSizeInBytes);
  if (mVar1 == MA_SUCCESS) {
    if (heapSizeInBytes == 0) {
      pHeap = (void *)0x0;
    }
    else {
      pHeap = ma_malloc(heapSizeInBytes,pAllocationCallbacks);
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar1 = ma_linear_resampler_init_preallocated(pConfig,pHeap,pResampler);
    if (mVar1 == MA_SUCCESS) {
      pResampler->_ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_linear_resampler_init(const ma_linear_resampler_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_linear_resampler* pResampler)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_linear_resampler_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_linear_resampler_init_preallocated(pConfig, pHeap, pResampler);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pResampler->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}